

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O2

vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>_>_>_>
* build_column_matrix<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*>>>,std::vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>>
            (vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>_>_>_>
             *__return_storage_ptr__,
            vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
            *rows,Column_settings *settings)

{
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_00;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_01;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_02;
  allocator_type local_79;
  int local_78 [2];
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_70;
  Column_settings *local_58;
  Column_zp_settings *local_50;
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_48;
  undefined8 uStack_30;
  undefined8 local_28;
  
  (__return_storage_ptr__->
  super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78[0] = 0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x100000000;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x200000001;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x300000003;
  uStack_30 = 0x400000005;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_48;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)&local_70,__l,&local_79);
  local_78[1] = 4;
  local_58 = settings;
  local_50 = (Column_zp_settings *)rows;
  std::
  vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*>>>,std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*>>>>>
  ::
  emplace_back<int,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,int,std::vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>*,Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>::Column_zp_settings*>
            ((vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*>>>,std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*>>>>>
              *)__return_storage_ptr__,local_78,
             (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              *)&local_70,local_78 + 1,
             (vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
              **)&local_50,&local_58);
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base(&local_70);
  local_78[0] = 1;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x400000000;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x200000001;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x100000002;
  uStack_30 = 0x100000005;
  local_28 = 0x100000006;
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&local_48;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)&local_70,__l_00,&local_79);
  local_78[1] = 4;
  local_58 = settings;
  local_50 = (Column_zp_settings *)rows;
  std::
  vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*>>>,std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*>>>>>
  ::
  emplace_back<int,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,int,std::vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>*,Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>::Column_zp_settings*>
            ((vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*>>>,std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*>>>>>
              *)__return_storage_ptr__,local_78,
             (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              *)&local_70,local_78 + 1,
             (vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
              **)&local_50,&local_58);
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base(&local_70);
  local_78[0] = 2;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x100000000;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x300000001;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x400000002;
  uStack_30 = 0x400000005;
  local_28 = 0x400000006;
  __l_01._M_len = 5;
  __l_01._M_array = (iterator)&local_48;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)&local_70,__l_01,&local_79);
  local_78[1] = 4;
  local_58 = settings;
  local_50 = (Column_zp_settings *)rows;
  std::
  vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*>>>,std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*>>>>>
  ::
  emplace_back<int,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,int,std::vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>*,Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>::Column_zp_settings*>
            ((vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*>>>,std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*>>>>>
              *)__return_storage_ptr__,local_78,
             (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              *)&local_70,local_78 + 1,
             (vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
              **)&local_50,&local_58);
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base(&local_70);
  local_58 = (Column_settings *)CONCAT44(local_58._4_4_,3);
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78[0] = 4;
  local_70._M_impl.super__Vector_impl_data._M_start = (pointer)rows;
  local_50 = settings;
  std::
  vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*>>>,std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*>>>>>
  ::
  emplace_back<int,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,int,std::vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>*,Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>::Column_zp_settings*>
            ((vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*>>>,std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*>>>>>
              *)__return_storage_ptr__,(int *)&local_58,
             (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              *)&local_48,local_78,
             (vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
              **)&local_70,&local_50);
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base(&local_48);
  local_78[0] = 4;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x100000000;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x200000001;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x300000003;
  uStack_30 = 0x400000005;
  __l_02._M_len = 4;
  __l_02._M_array = (iterator)&local_48;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)&local_70,__l_02,&local_79);
  local_78[1] = 4;
  local_58 = settings;
  local_50 = (Column_zp_settings *)rows;
  std::
  vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*>>>,std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*>>>>>
  ::
  emplace_back<int,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,int,std::vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>*,Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>::Column_zp_settings*>
            ((vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*>>>,std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*>>>>>
              *)__return_storage_ptr__,local_78,
             (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              *)&local_70,local_78 + 1,
             (vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
              **)&local_50,&local_58);
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base(&local_70);
  local_70._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_70._M_impl.super__Vector_impl_data._M_start._4_4_,5);
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)rows;
  std::
  vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*>>>,std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*>>>>>
  ::
  emplace_back<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*>>>&,int,std::vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>*>
            ((vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*>>>,std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*>>>>>
              *)__return_storage_ptr__,
             (__return_storage_ptr__->
             super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 1,(int *)&local_70,
             (vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
              **)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Column> build_column_matrix(Rows& rows, typename Column::Column_settings& settings) {
  std::vector<Column> matrix;

  if constexpr (is_z2<Column>()) {
    using cont = std::vector<unsigned int>;
    matrix.emplace_back(0, cont{0, 1, 3, 5}, 4, &rows, &settings);
    matrix.emplace_back(1, cont{0, 1, 2, 5, 6}, 4, &rows, &settings);
    matrix.emplace_back(2, cont{0, 1, 2, 5, 6}, 4, &rows, &settings);
    matrix.emplace_back(3, cont{}, 4, &rows, &settings);
    matrix.emplace_back(4, cont{0, 1, 3, 5}, 4, &rows, &settings);
    matrix.emplace_back(matrix[1], 5, &rows);
  } else {
    using cont = std::vector<std::pair<unsigned int, typename Column::Field_element> >;
    matrix.emplace_back(0, cont{{0, 1}, {1, 2}, {3, 3}, {5, 4}}, 4, &rows, &settings);
    matrix.emplace_back(1, cont{{0, 4}, {1, 2}, {2, 1}, {5, 1}, {6, 1}}, 4, &rows, &settings);
    matrix.emplace_back(2, cont{{0, 1}, {1, 3}, {2, 4}, {5, 4}, {6, 4}}, 4, &rows, &settings);
    matrix.emplace_back(3, cont{}, 4, &rows, &settings);
    matrix.emplace_back(4, cont{{0, 1}, {1, 2}, {3, 3}, {5, 4}}, 4, &rows, &settings);
    matrix.emplace_back(matrix[1], 5, &rows);
  }

  return matrix;
}